

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O1

wchar_t add_pattern_from_file
                  (archive_match *a,match_list *mlist,wchar_t mbs,void *pathname,
                  wchar_t nullSeparator)

{
  char cVar1;
  bool bVar2;
  bool bVar3;
  wchar_t wVar4;
  archive *_a;
  ulong n;
  int iVar5;
  void *_p;
  void *pvVar6;
  size_t size;
  void *buff;
  int64_t offset;
  archive_entry *ae;
  wchar_t local_8c;
  archive_string local_78;
  match_list *local_58;
  size_t local_50;
  void *local_48;
  la_int64_t local_40;
  archive_entry *local_38;
  
  local_58 = mlist;
  _a = archive_read_new();
  if (_a == (archive *)0x0) {
    archive_set_error(&a->archive,0xc,"No memory");
    wVar4 = L'\xffffffe2';
  }
  else {
    archive_read_support_format_raw(_a);
    wVar4 = archive_read_support_format_empty(_a);
    if (wVar4 == L'\0') {
      if (mbs == L'\0') {
        wVar4 = archive_read_open_filename_w(_a,(wchar_t *)pathname,0x2800);
      }
      else {
        wVar4 = archive_read_open_filename(_a,(char *)pathname,0x2800);
      }
      if (wVar4 == L'\0') {
        wVar4 = archive_read_next_header(_a,&local_38);
        if (wVar4 != L'\0') {
          archive_read_free(_a);
          if (wVar4 == L'\x01') {
            return L'\0';
          }
          archive_copy_error(&a->archive,_a);
          return wVar4;
        }
        local_78.s = (char *)0x0;
        local_78.length = 0;
        local_78.buffer_length = 0;
        local_8c = L'\0';
        do {
          wVar4 = archive_read_data_block(_a,&local_48,&local_50,&local_40);
          _p = local_48;
          if (wVar4 != L'\0') {
            if (wVar4 < L'\0') {
              archive_copy_error(&a->archive,_a);
              archive_read_free(_a);
              archive_string_free(&local_78);
              return wVar4;
            }
            if (((wVar4 == L'\x01') && (local_78.length != 0)) &&
               (wVar4 = add_pattern_mbs(a,local_58,local_78.s), wVar4 != L'\0')) {
              archive_read_free(_a);
              archive_string_free(&local_78);
              return wVar4;
            }
            archive_read_free(_a);
            archive_string_free(&local_78);
            return L'\0';
          }
          do {
            bVar2 = true;
            if (local_50 == 0) goto LAB_003bce38;
            pvVar6 = (void *)((long)_p + local_50);
            n = 0;
            do {
              cVar1 = *(char *)((long)_p + n);
              if (nullSeparator == L'\0') {
                if ((cVar1 == '\n') || (cVar1 == '\r')) goto LAB_003bcdaf;
              }
              else if (cVar1 == '\0') {
LAB_003bcdaf:
                pvVar6 = (void *)((long)_p + n + 1);
                local_50 = ~n + local_50;
                archive_strncat(&local_78,_p,n);
                iVar5 = 0;
                bVar3 = true;
                if (local_78.length != 0) {
                  wVar4 = add_pattern_mbs(a,local_58,local_78.s);
                  if (wVar4 == L'\0') {
                    local_78.length = 0;
                  }
                  else {
                    archive_read_free(_a);
                    archive_string_free(&local_78);
                    iVar5 = 1;
                    bVar3 = false;
                    local_8c = wVar4;
                  }
                }
                goto LAB_003bce25;
              }
              n = n + 1;
            } while (local_50 != n);
            archive_strncat(&local_78,_p,local_50);
            iVar5 = 7;
            bVar3 = false;
LAB_003bce25:
            _p = pvVar6;
          } while (iVar5 == 0);
          if (iVar5 != 7) {
            bVar2 = bVar3;
          }
LAB_003bce38:
          if (!bVar2) {
            return local_8c;
          }
        } while( true );
      }
    }
    archive_copy_error(&a->archive,_a);
    archive_read_free(_a);
  }
  return wVar4;
}

Assistant:

static int
add_pattern_from_file(struct archive_match *a, struct match_list *mlist,
    int mbs, const void *pathname, int nullSeparator)
{
	struct archive *ar;
	struct archive_entry *ae;
	struct archive_string as;
	const void *buff;
	size_t size;
	int64_t offset;
	int r;

	ar = archive_read_new(); 
	if (ar == NULL) {
		archive_set_error(&(a->archive), ENOMEM, "No memory");
		return (ARCHIVE_FATAL);
	}
	r = archive_read_support_format_raw(ar);
	r = archive_read_support_format_empty(ar);
	if (r != ARCHIVE_OK) {
		archive_copy_error(&(a->archive), ar);
		archive_read_free(ar);
		return (r);
	}
	if (mbs)
		r = archive_read_open_filename(ar, pathname, 512*20);
	else
		r = archive_read_open_filename_w(ar, pathname, 512*20);
	if (r != ARCHIVE_OK) {
		archive_copy_error(&(a->archive), ar);
		archive_read_free(ar);
		return (r);
	}
	r = archive_read_next_header(ar, &ae);
	if (r != ARCHIVE_OK) {
		archive_read_free(ar);
		if (r == ARCHIVE_EOF) {
			return (ARCHIVE_OK);
		} else {
			archive_copy_error(&(a->archive), ar);
			return (r);
		}
	}

	archive_string_init(&as);

	while ((r = archive_read_data_block(ar, &buff, &size, &offset))
	    == ARCHIVE_OK) {
		const char *b = (const char *)buff;

		while (size) {
			const char *s = (const char *)b;
			size_t length = 0;
			int found_separator = 0;

			while (length < size) {
				if (nullSeparator) {
					if (*b == '\0') {
						found_separator = 1;
						break;
					}
				} else {
			            	if (*b == 0x0d || *b == 0x0a) {
						found_separator = 1;
						break;
					}
				}
				b++;
				length++;
			}
			if (!found_separator) {
				archive_strncat(&as, s, length);
				/* Read next data block. */
				break;
			}
			b++;
			size -= length + 1;
			archive_strncat(&as, s, length);

			/* If the line is not empty, add the pattern. */
			if (archive_strlen(&as) > 0) {
				/* Add pattern. */
				r = add_pattern_mbs(a, mlist, as.s);
				if (r != ARCHIVE_OK) {
					archive_read_free(ar);
					archive_string_free(&as);
					return (r);
				}
				archive_string_empty(&as);
			}
		}
	}

	/* If an error occurred, report it immediately. */
	if (r < ARCHIVE_OK) {
		archive_copy_error(&(a->archive), ar);
		archive_read_free(ar);
		archive_string_free(&as);
		return (r);
	}

	/* If the line is not empty, add the pattern. */
	if (r == ARCHIVE_EOF && archive_strlen(&as) > 0) {
		/* Add pattern. */
		r = add_pattern_mbs(a, mlist, as.s);
		if (r != ARCHIVE_OK) {
			archive_read_free(ar);
			archive_string_free(&as);
			return (r);
		}
	}
	archive_read_free(ar);
	archive_string_free(&as);
	return (ARCHIVE_OK);
}